

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQInteger __thiscall SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  SQInteger curop;
  SQInteger mid;
  SQInteger high;
  SQInteger low;
  SQInteger line;
  SQInteger op;
  SQInstruction *curr_local;
  SQFunctionProto *this_local;
  
  lVar3 = (long)curr - (long)this->_instructions >> 3;
  low = 0;
  high = this->_nlineinfos + -1;
  mid = 0;
  while (low <= high) {
    mid = low + (high - low >> 1);
    lVar1 = this->_lineinfos[mid]._op;
    if (lVar3 < lVar1) {
      high = mid + -1;
    }
    else {
      if ((lVar3 <= lVar1) ||
         ((mid < this->_nlineinfos + -1 && (lVar3 <= this->_lineinfos[mid + 1]._op)))) break;
      low = mid + 1;
    }
  }
  while( true ) {
    bVar2 = false;
    if (0 < mid) {
      bVar2 = lVar3 <= this->_lineinfos[mid]._op;
    }
    if (!bVar2) break;
    mid = mid + -1;
  }
  return this->_lineinfos[mid]._line;
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr)
{
    SQInteger op = (SQInteger)(curr-_instructions);
    SQInteger line=_lineinfos[0]._line;
    SQInteger low = 0;
    SQInteger high = _nlineinfos - 1;
    SQInteger mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        SQInteger curop = _lineinfos[mid]._op;
        if(curop > op)
        {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    return line;
}